

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O1

void usage(string *msg)

{
  if (msg->_M_string_length != 0) {
    fprintf(_stderr,"pbrt: %s\n\n",(msg->_M_dataplus)._M_p);
  }
  fprintf(_stderr,
          "usage: pbrt [<options>] <filename.pbrt...>\n\nRendering options:\n  --cropwindow <x0,x1,y0,y1>   Specify an image crop window w.r.t. [0,1]^2\n  --debugstart <values>        Inform the Integrator where to start rendering for\n                               faster debugging. (<values> are Integrator-specific\n                               and come from error message text.)\n  --disable-pixel-jitter       Always sample pixels at their centers.\n  --disable-wavelength-jitter  Always sample the same %d wavelengths of light.\n  --display-server <addr:port> Connect to display server at given address and port\n                               to display the image as it\'s being rendered.\n  --force-diffuse              Convert all materials to be diffuse.\n  --help                       Print this help text.\n  --mse-reference-image        Filename for reference image to use for MSE computation.\n  --mse-reference-out          File to write MSE error vs spp results.\n  --nthreads <num>             Use specified number of threads for rendering.\n  --outfile <filename>         Write the final image to the given filename.\n  --pixel <x,y>                Render just the specified pixel.\n  --pixelbounds <x0,x1,y0,y1>  Specify an image crop window w.r.t. pixel coordinates.\n  --pixelstats                 Record per-pixel statistics and write additional images\n                               with their values.\n  --quick                      Automatically reduce a number of quality settings\n                               to render more quickly.\n  --quiet                      Suppress all text output other than error messages.\n  --render-coord-sys <name>    Coordinate system to use for the scene when rendering,\n                               where name is \"camera\", \"cameraworld\", or \"world\".\n  --seed <n>                   Set random number generator seed. Default: 0.\n  --spp <n>                    Override number of pixel samples specified in scene\n                               description file.\n  --write-partial-images       Periodically write the ..." /* TRUNCATED STRING LITERAL */
          ,4);
  exit((uint)(msg->_M_string_length != 0));
}

Assistant:

static void usage(const std::string &msg = {}) {
    if (!msg.empty())
        fprintf(stderr, "pbrt: %s\n\n", msg.c_str());

    fprintf(stderr,
            R"(usage: pbrt [<options>] <filename.pbrt...>

Rendering options:
  --cropwindow <x0,x1,y0,y1>   Specify an image crop window w.r.t. [0,1]^2
  --debugstart <values>        Inform the Integrator where to start rendering for
                               faster debugging. (<values> are Integrator-specific
                               and come from error message text.)
  --disable-pixel-jitter       Always sample pixels at their centers.
  --disable-wavelength-jitter  Always sample the same %d wavelengths of light.
  --display-server <addr:port> Connect to display server at given address and port
                               to display the image as it's being rendered.
  --force-diffuse              Convert all materials to be diffuse.)"
#ifdef PBRT_BUILD_GPU_RENDERER
            R"(
  --gpu                        Use the GPU for rendering. (Default: disabled)
  --gpu-device <index>         Use specified GPU for rendering.)"
#endif
            R"(
  --help                       Print this help text.
  --mse-reference-image        Filename for reference image to use for MSE computation.
  --mse-reference-out          File to write MSE error vs spp results.
  --nthreads <num>             Use specified number of threads for rendering.
  --outfile <filename>         Write the final image to the given filename.
  --pixel <x,y>                Render just the specified pixel.
  --pixelbounds <x0,x1,y0,y1>  Specify an image crop window w.r.t. pixel coordinates.
  --pixelstats                 Record per-pixel statistics and write additional images
                               with their values.
  --quick                      Automatically reduce a number of quality settings
                               to render more quickly.
  --quiet                      Suppress all text output other than error messages.
  --render-coord-sys <name>    Coordinate system to use for the scene when rendering,
                               where name is "camera", "cameraworld", or "world".
  --seed <n>                   Set random number generator seed. Default: 0.
  --spp <n>                    Override number of pixel samples specified in scene
                               description file.
  --write-partial-images       Periodically write the current image to disk, rather
                               than waiting for the end of rendering. Default: disabled.

Logging options:
  --log-level <level>          Log messages at or above this level, where <level>
                               is "verbose", "error", or "fatal". Default: "error".

Reformatting options:
  --format                     Print a reformatted version of the input file(s) to
                               standard output. Does not render an image.
  --toply                      Print a reformatted version of the input file(s) to
                               standard output and convert all triangle meshes to
                               PLY files. Does not render an image.
  --upgrade                    Upgrade a pbrt-v3 file to pbrt-v4's format.
)",
            NSpectrumSamples);
    exit(msg.empty() ? 0 : 1);
}